

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

void __thiscall UCAFL::~UCAFL(UCAFL *this)

{
  if (this->h1_ != 0) {
    uc_hook_del(this->uc_);
  }
  if (this->h2_ != 0) {
    uc_hook_del(this->uc_);
  }
  if (this->h3_ != 0) {
    uc_hook_del(this->uc_);
  }
  if (this->h4_ != 0) {
    uc_hook_del(this->uc_);
  }
  if (this->has_afl_ != false) {
    return;
  }
  munmap(this->afl_area_ptr_,0x10000);
  return;
}

Assistant:

~UCAFL() {
        if (this->h1_) {
            uc_hook_del(this->uc_, this->h1_);
        }

        if (this->h2_) {
            uc_hook_del(this->uc_, this->h2_);
        }

        if (this->h3_) {
            uc_hook_del(this->uc_, this->h3_);
        }

        if (this->h4_) {
            uc_hook_del(this->uc_, this->h4_);
        }

        if (!this->has_afl_) {
            munmap(this->afl_area_ptr_, MAP_SIZE);
        }
    }